

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O1

uint32_t fnode_service_recv_cmd(fnode_service_t *svc)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  _Bool _Var8;
  uint32_t uVar9;
  long lVar10;
  fnet_address_t *pfVar11;
  fnet_address_t *pfVar12;
  byte bVar13;
  size_t read_len;
  char resp_freq_str [5];
  char keepalive_str [5];
  fnet_address_t addr;
  char buf [65536];
  size_t sStack_100c0;
  undefined4 uStack_100b8;
  undefined1 uStack_100b4;
  undefined4 uStack_100b0;
  undefined1 uStack_100ac;
  fnet_address_t fStack_100a8;
  int iStack_10028;
  undefined4 uStack_10024;
  undefined4 uStack_10020;
  
  bVar13 = 0;
  sStack_100c0 = 0;
  _Var8 = fnet_socket_recvfrom
                    (svc->socket,(char *)&iStack_10028,0x10000,&sStack_100c0,&fStack_100a8);
  if (!_Var8) {
    return 0;
  }
  uVar9 = 0;
  if (sStack_100c0 < 4) {
    return 0;
  }
  if (iStack_10028 == 0x41544144) {
    uVar9 = 0x41544144;
    (*svc->data_handler)(0x41544144,(char *)&uStack_10024,(int)sStack_100c0 - 4);
  }
  else if (iStack_10028 == 0x474e4f50) {
    uVar9 = 0x444c564e;
    if (sStack_100c0 == 4) {
      uVar9 = 0x474e4f50;
    }
  }
  else {
    if (iStack_10028 != 0x464e4f43) {
      bVar1 = true;
      goto LAB_00102abb;
    }
    if (0xb < sStack_100c0) {
      uStack_100b0 = uStack_10024;
      uStack_100b8 = uStack_10020;
      bVar1 = false;
      uStack_100ac = 0;
      uStack_100b4 = 0;
      uVar9 = atoi((char *)&uStack_100b0);
      svc->keepalive = uVar9;
      uVar9 = atoi((char *)&uStack_100b8);
      svc->resp_freq = uVar9;
      pfVar11 = &fStack_100a8;
      pfVar12 = &svc->server;
      for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
        cVar2 = pfVar11->__ss_padding[0];
        cVar3 = pfVar11->__ss_padding[1];
        cVar4 = pfVar11->__ss_padding[2];
        cVar5 = pfVar11->__ss_padding[3];
        cVar6 = pfVar11->__ss_padding[4];
        cVar7 = pfVar11->__ss_padding[5];
        pfVar12->ss_family = pfVar11->ss_family;
        pfVar12->__ss_padding[0] = cVar2;
        pfVar12->__ss_padding[1] = cVar3;
        pfVar12->__ss_padding[2] = cVar4;
        pfVar12->__ss_padding[3] = cVar5;
        pfVar12->__ss_padding[4] = cVar6;
        pfVar12->__ss_padding[5] = cVar7;
        pfVar11 = (fnet_address_t *)((long)pfVar11 + ((ulong)bVar13 * -2 + 1) * 8);
        pfVar12 = (fnet_address_t *)((long)pfVar12 + (ulong)bVar13 * -0x10 + 8);
      }
      uVar9 = 0x464e4f43;
      goto LAB_00102abb;
    }
    uVar9 = 0x444c564e;
  }
  bVar1 = false;
LAB_00102abb:
  if (bVar1) {
    return 0;
  }
  return uVar9;
}

Assistant:

uint32_t fnode_service_recv_cmd(fnode_service_t *svc)
{
    char buf[65536];
    size_t read_len = 0;
    fnet_address_t addr;

    if (fnet_socket_recvfrom(svc->socket, buf, sizeof buf, &read_len, &addr))
    {
        if (read_len < FCMD_ID_LENGTH)
            return false;

        uint32_t const cmd = *(uint32_t const*)buf;

        switch(cmd)
        {
            case FCMD_CONF:
            {
                if (read_len < sizeof(fcmd_conf))
                    return FCMD_NVLD;
                fcmd_conf const *conf = (fcmd_conf const *)buf;
                char keepalive_str[sizeof conf->keepalive + 1];
                char resp_freq_str[sizeof conf->resp_freq + 1];
                memcpy(keepalive_str, conf->keepalive, sizeof conf->keepalive);
                memcpy(resp_freq_str, conf->resp_freq, sizeof conf->resp_freq);
                keepalive_str[sizeof conf->keepalive] = 0;
                resp_freq_str[sizeof conf->resp_freq] = 0;
                svc->keepalive = atoi(keepalive_str);
                svc->resp_freq = atoi(resp_freq_str);
                svc->server = addr;
                return cmd;
            }

            case FCMD_PONG:
            {
                return read_len == sizeof(fcmd_pong) ? cmd : FCMD_NVLD;
            }

            case FCMD_DATA:
            {
                svc->data_handler(cmd, buf + FCMD_ID_LENGTH, read_len - FCMD_ID_LENGTH);
                return cmd;
            }
        }
    }
    return false;
}